

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O1

iterator __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::FindMacroDefinition
          (ConversionStream *this,string *MacroName)

{
  _Hash_node_base *__n;
  _List_node_base *p_Var1;
  int iVar2;
  __node_base_ptr p_Var3;
  long lVar4;
  _List_node_base *p_Var5;
  _Hash_node_base *p_Var6;
  HashMapStringKey local_38;
  
  HashMapStringKey::HashMapStringKey(&local_38,(MacroName->_M_dataplus)._M_p,false);
  p_Var3 = std::
           _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_before_node
                     (&(this->m_PreprocessorDefinitions)._M_h,
                      (local_38.Ownership_Hash & 0x7fffffffffffffff) %
                      (this->m_PreprocessorDefinitions)._M_h._M_bucket_count,&local_38,
                      local_38.Ownership_Hash & 0x7fffffffffffffff);
  if (p_Var3 == (__node_base_ptr)0x0) {
    p_Var6 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var6 = p_Var3->_M_nxt;
  }
  if ((local_38.Str != (Char *)0x0) && ((long)local_38.Ownership_Hash < 0)) {
    operator_delete__(local_38.Str);
  }
  if (p_Var6 == (_Hash_node_base *)0x0) {
    p_Var5 = (_List_node_base *)&this->m_Tokens;
  }
  else {
    p_Var6 = (p_Var6[3]._M_nxt)->_M_nxt;
    p_Var5 = (_List_node_base *)&this->m_Tokens;
    if (((((_List_node_base *)p_Var6 != p_Var5) &&
         (__n = p_Var6[4]._M_nxt, __n == (_Hash_node_base *)MacroName->_M_string_length)) &&
        ((__n == (_Hash_node_base *)0x0 ||
         (iVar2 = bcmp(p_Var6[3]._M_nxt,(MacroName->_M_dataplus)._M_p,(size_t)__n), iVar2 == 0))))
       && ((p_Var1 = (_List_node_base *)p_Var6->_M_nxt, p_Var1 != p_Var5 &&
           (lVar4 = std::__cxx11::string::find_first_of((char *)&p_Var1[3]._M_prev,0x84158f,0),
           lVar4 == -1)))) {
      if (*(int *)&p_Var1[1]._M_next - 1U < 0xbf) {
        p_Var5 = p_Var1;
      }
      if (*(int *)&p_Var1[1]._M_next == 0x13b) {
        p_Var5 = p_Var1;
      }
    }
  }
  return (iterator)p_Var5;
}

Assistant:

HLSL2GLSLConverterImpl::TokenListType::iterator HLSL2GLSLConverterImpl::ConversionStream::FindMacroDefinition(const std::string& MacroName)
{
    auto define_it = m_PreprocessorDefinitions.find(MacroName.c_str());
    if (define_it == m_PreprocessorDefinitions.end())
        return m_Tokens.end();

    auto Token = define_it->second;
    // #define PS_OUTPUT PSOutput
    // ^

    ++Token;
    // #define PS_OUTPUT PSOutput
    //         ^
    if (Token == m_Tokens.end() || Token->Literal != MacroName)
        return m_Tokens.end();

    ++Token;
    // #define PS_OUTPUT PSOutput
    //                   ^

    // Check that the definition is on the same line (we don't handle multiline definitions)
    if (Token == m_Tokens.end() || Token->Delimiter.find_first_of("\r\n") != std::string::npos)
        return m_Tokens.end();

    return (Token->IsBuiltInType() || Token->Type == TokenType::Identifier) ? Token : m_Tokens.end();
}